

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  long lVar2;
  ostream *poVar3;
  pointer pMVar4;
  pointer pMVar5;
  char *pcVar6;
  string local_a0;
  undefined1 local_80 [32];
  ReusableStringStream msg;
  string local_50 [32];
  
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  if ((OVar1 != ExplicitSkip) &&
     (((byte)OVar1 >> 4 &
      ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0) == 0))
  goto LAB_0014b0e7;
  ReusableStringStream::ReusableStringStream(&msg);
  poVar3 = msg.m_oss;
  if (this->m_headerPrintedForThisSection == false) {
    printSectionHeader(this,msg.m_oss);
  }
  this->m_headerPrintedForThisSection = true;
  local_a0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_a0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(poVar3,(SourceLineInfo *)&local_a0);
  std::operator<<(poVar3,'\n');
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  switch(OVar1) {
  case Ok:
  case Info:
  case Warning:
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_80);
    std::operator<<((ostream *)local_80._8_8_,"Internal error in TeamCity reporter");
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_a0);
  case Warning|Info:
  case ExplicitSkip|Info:
  case ExplicitSkip|Warning:
  case ExplicitSkip|Warning|Info:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    goto switchD_0014ae1a_caseD_3;
  case ExplicitSkip:
    pcVar6 = "explicit skip";
    break;
  case ExpressionFailed:
    pcVar6 = "expression failed";
    break;
  case ExplicitFailure:
    pcVar6 = "explicit failure";
    break;
  case Unknown:
  case FailureBit:
switchD_0014ae1a_caseD_ffffffff:
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_80);
    std::operator<<((ostream *)local_80._8_8_,"Not implemented");
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_a0);
  default:
    if (OVar1 == ThrewException) {
      pcVar6 = "unexpected exception";
    }
    else if (OVar1 == DidntThrowException) {
      pcVar6 = "no exception was thrown where one was expected";
    }
    else {
      if (OVar1 != FatalErrorCondition) {
        if (OVar1 == Exception) goto switchD_0014ae1a_caseD_ffffffff;
        goto switchD_0014ae1a_caseD_3;
      }
      pcVar6 = "fatal error condition";
    }
  }
  std::operator<<(poVar3,pcVar6);
switchD_0014ae1a_caseD_3:
  pMVar5 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pMVar4 - (long)pMVar5;
  if (lVar2 == 0x48) {
    std::operator<<(poVar3," with message:");
    pMVar5 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar2 = (long)pMVar4 - (long)pMVar5;
  }
  if (1 < (ulong)(lVar2 / 0x48)) {
    std::operator<<(poVar3," with messages:");
    pMVar5 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pMVar5 != pMVar4; pMVar5 = pMVar5 + 1) {
    std::operator<<(poVar3,"\n  \"");
    std::operator<<(poVar3,(string *)&pMVar5->message);
    poVar3 = msg.m_oss;
    std::operator<<(msg.m_oss,'\"');
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::operator<<(poVar3,"\n  ");
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a0,&assertionStats->assertionResult);
    std::operator<<(poVar3,(string *)&local_a0);
    std::operator<<(poVar3,"\nwith expansion:\n  ");
    AssertionResult::getExpandedExpression_abi_cxx11_
              ((string *)local_80,&assertionStats->assertionResult);
    std::operator<<(poVar3,(string *)local_80);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  pcVar6 = "##teamcity[testIgnored";
  if ((assertionStats->assertionResult).m_resultData.resultType != ExplicitSkip) {
    if ((((this->super_StreamingReporterBase).currentTestCaseInfo)->properties &
        (MayFail|ShouldFail)) == None) {
      pcVar6 = "##teamcity[testFailed";
    }
    else {
      std::operator<<(msg.m_oss,"- failure ignore as test marked as \'ok to fail\'\n");
    }
  }
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,pcVar6);
  poVar3 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           " name=\'");
  (anonymous_namespace)::escape_abi_cxx11_(stack0xffffffffffffff98);
  poVar3 = std::operator<<(poVar3,(string *)&local_a0);
  poVar3 = std::operator<<(poVar3,'\'');
  poVar3 = std::operator<<(poVar3," message=\'");
  std::__cxx11::stringbuf::str();
  (anonymous_namespace)::escape_abi_cxx11_(stack0xffffffffffffff98);
  poVar3 = std::operator<<(poVar3,(string *)local_80);
  poVar3 = std::operator<<(poVar3,'\'');
  std::operator<<(poVar3,"]\n");
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  ReusableStringStream::~ReusableStringStream(&msg);
LAB_0014b0e7:
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::assertionEnded(AssertionStats const& assertionStats) {
        AssertionResult const& result = assertionStats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;
            case ResultWas::ExplicitSkip:
                msg << "explicit skip";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const& messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                m_stream << "##teamcity[testIgnored";
            } else if ( currentTestCaseInfo->okToFail() ) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                m_stream << "##teamcity[testIgnored";
            } else {
                m_stream << "##teamcity[testFailed";
            }
            m_stream << " name='" << escape( currentTestCaseInfo->name ) << '\''
                     << " message='" << escape( msg.str() ) << '\'' << "]\n";
        }
        m_stream.flush();
    }